

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int compare_socket_address(sockaddr *x,sockaddr *y)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  ushort *in_RSI;
  ushort *in_RDI;
  int r;
  sockaddr_in6 *yin6;
  sockaddr_in6 *xin6;
  sockaddr_in *yin;
  sockaddr_in *xin;
  
  if (*in_RDI != *in_RSI) {
    if (*in_RSI <= *in_RDI) {
      return 1;
    }
    return -1;
  }
  if (*in_RDI == 2) {
    uVar3 = ntohl(*(uint32_t *)(in_RDI + 2));
    uVar4 = ntohl(*(uint32_t *)(in_RSI + 2));
    if (uVar3 != uVar4) {
      uVar3 = ntohl(*(uint32_t *)(in_RDI + 2));
      uVar4 = ntohl(*(uint32_t *)(in_RSI + 2));
      if (uVar4 <= uVar3) {
        return 1;
      }
      return -1;
    }
    uVar1 = ntohs(in_RDI[1]);
    uVar2 = ntohs(in_RSI[1]);
    if (uVar1 != uVar2) {
      uVar1 = ntohs(in_RDI[1]);
      uVar2 = ntohs(in_RSI[1]);
      if (uVar2 <= uVar1) {
        return 1;
      }
      return -1;
    }
  }
  else {
    if (*in_RDI != 10) {
      if (*in_RDI == 0) {
        return 1;
      }
      __assert_fail("!\"unknown sa_family\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x13f3,"int compare_socket_address(struct sockaddr *, struct sockaddr *)");
    }
    iVar5 = memcmp(in_RDI + 4,in_RSI + 4,0x10);
    if (iVar5 != 0) {
      return iVar5;
    }
    uVar1 = ntohs(in_RDI[1]);
    uVar2 = ntohs(in_RSI[1]);
    if (uVar1 != uVar2) {
      uVar1 = ntohs(in_RDI[1]);
      uVar2 = ntohs(in_RSI[1]);
      if (uVar2 <= uVar1) {
        return 1;
      }
      return -1;
    }
    if (*(int *)(in_RDI + 2) != *(int *)(in_RSI + 2)) {
      if (*(uint *)(in_RSI + 2) <= *(uint *)(in_RDI + 2)) {
        return 1;
      }
      return -1;
    }
    if (*(int *)(in_RDI + 0xc) != *(int *)(in_RSI + 0xc)) {
      if (*(uint *)(in_RSI + 0xc) <= *(uint *)(in_RDI + 0xc)) {
        return 1;
      }
      return -1;
    }
  }
  return 0;
}

Assistant:

static int compare_socket_address(struct sockaddr *x, struct sockaddr *y)
{
#define CMP(a, b)                                                                                                                  \
    if (a != b)                                                                                                                    \
    return a < b ? -1 : 1

    CMP(x->sa_family, y->sa_family);

    if (x->sa_family == AF_INET) {
        struct sockaddr_in *xin = (void *)x, *yin = (void *)y;
        CMP(ntohl(xin->sin_addr.s_addr), ntohl(yin->sin_addr.s_addr));
        CMP(ntohs(xin->sin_port), ntohs(yin->sin_port));
    } else if (x->sa_family == AF_INET6) {
        struct sockaddr_in6 *xin6 = (void *)x, *yin6 = (void *)y;
        int r = memcmp(xin6->sin6_addr.s6_addr, yin6->sin6_addr.s6_addr, sizeof(xin6->sin6_addr.s6_addr));
        if (r != 0)
            return r;
        CMP(ntohs(xin6->sin6_port), ntohs(yin6->sin6_port));
        CMP(xin6->sin6_flowinfo, yin6->sin6_flowinfo);
        CMP(xin6->sin6_scope_id, yin6->sin6_scope_id);
    } else if (x->sa_family == AF_UNSPEC) {
        return 1;
    } else {
        assert(!"unknown sa_family");
    }

#undef CMP
    return 0;
}